

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O2

void __thiscall
OpenMD::DataStorage::internalResize<OpenMD::Vector3<double>>
          (DataStorage *this,
          vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *v,
          size_t newSize)

{
  pointer pVVar1;
  const_iterator __last;
  ulong uVar2;
  difference_type __d;
  size_type __n;
  Vector<double,_3U> VStack_38;
  
  pVVar1 = (v->
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (v->super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  uVar2 = ((long)__last._M_current - (long)pVVar1) / 0x18;
  __n = newSize - uVar2;
  if (__n != 0) {
    if (newSize < uVar2 || __n == 0) {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::erase
                (v,pVVar1 + newSize,__last);
      return;
    }
    Vector<double,_3U>::Vector(&VStack_38);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::insert
              (v,__last,__n,(value_type *)&VStack_38);
  }
  return;
}

Assistant:

void DataStorage::internalResize(std::vector<T>& v, std::size_t newSize) {
    std::size_t oldSize = v.size();

    if (oldSize == newSize) {
      return;
    } else if (oldSize < newSize) {
      v.insert(v.end(), newSize - oldSize, T());
    } else {
      typename std::vector<T>::iterator i;
      i = v.begin();
      std::advance(i, newSize);
      v.erase(i, v.end());
    }
  }